

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FloatMixTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FloatMixTexture *this)

{
  FloatTextureHandle *in_R9;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ FloatMixTexture tex1: %s tex2: %s amount: %s ]",
             (char *)this,&this->tex2,&this->amount,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatMixTexture::ToString() const {
    return StringPrintf("[ FloatMixTexture tex1: %s tex2: %s amount: %s ]", tex1, tex2,
                        amount);
}